

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EthBasePort.cpp
# Opt level: O1

void EthBasePort::PrintMAC(ostream *outStr,char *name,uint8_t *addr,bool swap16)

{
  ostream oVar1;
  size_t sVar2;
  ostream *poVar3;
  byte *pbVar4;
  long *plVar5;
  undefined7 in_register_00000009;
  long lVar6;
  long lVar7;
  long lVar8;
  long local_38;
  
  if ((int)CONCAT71(in_register_00000009,swap16) == 0) {
    if (name == (char *)0x0) {
      std::ios::clear((int)outStr + (int)*(undefined8 *)(*(long *)outStr + -0x18));
    }
    else {
      sVar2 = strlen(name);
      std::__ostream_insert<char,std::char_traits<char>>(outStr,name,sVar2);
    }
    std::__ostream_insert<char,std::char_traits<char>>(outStr,": ",2);
    lVar6 = *(long *)outStr;
    *(uint *)(outStr + *(long *)(lVar6 + -0x18) + 0x18) =
         *(uint *)(outStr + *(long *)(lVar6 + -0x18) + 0x18) & 0xffffffb5 | 8;
    *(undefined8 *)(outStr + *(long *)(lVar6 + -0x18) + 0x10) = 2;
    poVar3 = outStr + *(long *)(lVar6 + -0x18);
    if (outStr[*(long *)(lVar6 + -0x18) + 0xe1] == (ostream)0x0) {
      oVar1 = (ostream)std::ios::widen((char)poVar3);
      poVar3[0xe0] = oVar1;
      poVar3[0xe1] = (ostream)0x1;
    }
    poVar3[0xe0] = (ostream)0x30;
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)outStr,(uint)*addr);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,":",1);
    pbVar4 = addr + 1;
    local_38 = 5;
    lVar7 = 4;
    lVar8 = 3;
    lVar6 = 2;
  }
  else {
    if (name == (char *)0x0) {
      std::ios::clear((int)outStr + (int)*(undefined8 *)(*(long *)outStr + -0x18));
    }
    else {
      sVar2 = strlen(name);
      std::__ostream_insert<char,std::char_traits<char>>(outStr,name,sVar2);
    }
    std::__ostream_insert<char,std::char_traits<char>>(outStr,": ",2);
    lVar6 = *(long *)outStr;
    *(uint *)(outStr + *(long *)(lVar6 + -0x18) + 0x18) =
         *(uint *)(outStr + *(long *)(lVar6 + -0x18) + 0x18) & 0xffffffb5 | 8;
    *(undefined8 *)(outStr + *(long *)(lVar6 + -0x18) + 0x10) = 2;
    poVar3 = outStr + *(long *)(lVar6 + -0x18);
    if (outStr[*(long *)(lVar6 + -0x18) + 0xe1] == (ostream)0x0) {
      oVar1 = (ostream)std::ios::widen((char)poVar3);
      poVar3[0xe0] = oVar1;
      poVar3[0xe1] = (ostream)0x1;
    }
    poVar3[0xe0] = (ostream)0x30;
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)outStr,(uint)addr[1]);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,":",1);
    local_38 = 4;
    lVar7 = 5;
    lVar6 = 3;
    lVar8 = 2;
    pbVar4 = addr;
  }
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,(uint)*pbVar4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,":",1);
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,(uint)addr[lVar6]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,":",1);
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,(uint)addr[lVar8]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,":",1);
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,(uint)addr[lVar7]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,":",1);
  plVar5 = (long *)std::ostream::operator<<((ostream *)poVar3,(uint)addr[local_38]);
  lVar6 = *plVar5;
  lVar7 = *(long *)(lVar6 + -0x18);
  *(uint *)((long)plVar5 + lVar7 + 0x18) = *(uint *)((long)plVar5 + lVar7 + 0x18) & 0xffffffb5 | 2;
  std::ios::widen((char)*(undefined8 *)(lVar6 + -0x18) + (char)plVar5);
  std::ostream::put((char)plVar5);
  std::ostream::flush();
  return;
}

Assistant:

void EthBasePort::PrintMAC(std::ostream &outStr, const char* name, const uint8_t *addr, bool swap16)
{
    if (swap16) {
        outStr << name << ": " << std::hex << std::setw(2) << std::setfill('0')
               << (int)addr[1] << ":" << (int)addr[0] << ":" << (int)addr[3] << ":"
               << (int)addr[2] << ":" << (int)addr[5] << ":" << (int)addr[4] << std::dec << std::endl;
    }
    else {
        outStr << name << ": " << std::hex << std::setw(2) << std::setfill('0')
               << (int)addr[0] << ":" << (int)addr[1] << ":" << (int)addr[2] << ":"
               << (int)addr[3] << ":" << (int)addr[4] << ":" << (int)addr[5] << std::dec << std::endl;
    }
}